

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  bool bVar1;
  i64 *piVar2;
  int iVar3;
  long lVar4;
  i64 iVar5;
  bool bVar6;
  bool bVar7;
  i64 *local_58;
  char *zEnd;
  char *zStart;
  int nonNum;
  int c;
  int i;
  int neg;
  u64 u;
  int incr;
  u8 enc_local;
  int length_local;
  i64 *pNum_local;
  char *zNum_local;
  
  _i = 0;
  bVar1 = false;
  zStart._4_4_ = 0;
  bVar6 = false;
  lVar4 = (long)length;
  if (enc == '\x01') {
    u._4_4_ = 1;
    pNum_local = (i64 *)zNum;
  }
  else {
    u._4_4_ = 2;
    nonNum = 3 - (uint)enc;
    while( true ) {
      bVar6 = false;
      if (nonNum < length) {
        bVar6 = zNum[nonNum] == '\0';
      }
      if (!bVar6) break;
      nonNum = nonNum + 2;
    }
    bVar6 = nonNum < length;
    lVar4 = (long)(int)(nonNum ^ 1);
    pNum_local = (i64 *)(zNum + (int)(enc & 1));
  }
  local_58 = (i64 *)(zNum + lVar4);
  while( true ) {
    bVar7 = false;
    if (pNum_local < local_58) {
      bVar7 = (""[(byte)*pNum_local] & 1) != 0;
    }
    if (!bVar7) break;
    pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
  }
  piVar2 = pNum_local;
  if (pNum_local < local_58) {
    if ((char)*pNum_local == '-') {
      bVar1 = true;
      pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
      piVar2 = pNum_local;
    }
    else if ((char)*pNum_local == '+') {
      pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
      piVar2 = pNum_local;
    }
  }
  while( true ) {
    bVar7 = false;
    if (pNum_local < local_58) {
      bVar7 = (char)*pNum_local == '0';
    }
    if (!bVar7) break;
    pNum_local = (i64 *)((long)pNum_local + (long)u._4_4_);
  }
  nonNum = 0;
  while( true ) {
    bVar7 = false;
    if ((i64 *)((long)pNum_local + (long)nonNum) < local_58) {
      zStart._4_4_ = (int)*(char *)((long)pNum_local + (long)nonNum);
      bVar7 = false;
      if (0x2f < zStart._4_4_) {
        bVar7 = zStart._4_4_ < 0x3a;
      }
    }
    if (!bVar7) break;
    _i = (_i * 10 + (long)zStart._4_4_) - 0x30;
    nonNum = u._4_4_ + nonNum;
  }
  if (_i < 0x8000000000000000) {
    if (bVar1) {
      *pNum = -_i;
    }
    else {
      *pNum = _i;
    }
  }
  else {
    iVar5 = 0x7fffffffffffffff;
    if (bVar1) {
      iVar5 = -0x8000000000000000;
    }
    *pNum = iVar5;
  }
  if ((((i64 *)((long)pNum_local + (long)nonNum) < local_58) ||
      (((nonNum == 0 && (piVar2 == pNum_local)) ||
       (nonNum != u._4_4_ * 0x13 && SBORROW4(nonNum,u._4_4_ * 0x13) == nonNum + u._4_4_ * -0x13 < 0)
       ))) || (bVar6)) {
    zNum_local._4_4_ = 1;
  }
  else if (SBORROW4(nonNum,u._4_4_ * 0x13) == nonNum + u._4_4_ * -0x13 < 0) {
    iVar3 = compare2pow63((char *)pNum_local,u._4_4_);
    if (iVar3 < 0) {
      zNum_local._4_4_ = 0;
    }
    else if (iVar3 < 1) {
      zNum_local._4_4_ = 2;
      if (bVar1) {
        zNum_local._4_4_ = 0;
      }
    }
    else {
      zNum_local._4_4_ = 1;
    }
  }
  else {
    zNum_local._4_4_ = 0;
  }
  return zNum_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( &zNum[i]<zEnd              /* Extra bytes at the end */
   || (i==0 && zStart==zNum)     /* No digits */
   || i>19*incr                  /* Too many digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}